

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::PushAddress
          (PeerManagerImpl *this,Peer *peer,CAddress *addr)

{
  CRollingBloomFilter *this_00;
  pointer pCVar1;
  long lVar2;
  ServiceFlags SVar3;
  uint32_t uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint64_t uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((peer->m_addr_known)._M_t.
      super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>._M_t.
      super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
      super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl == (CRollingBloomFilter *)0x0
     ) {
    __assert_fail("peer.m_addr_known",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                  ,0x4dd,
                  "void (anonymous namespace)::PeerManagerImpl::PushAddress(Peer &, const CAddress &)"
                 );
  }
  bVar5 = CNetAddr::IsValid((CNetAddr *)addr);
  if (bVar5) {
    this_00 = (peer->m_addr_known)._M_t.
              super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>.
              _M_t.
              super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>
              .super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
    CService::GetKey(&local_50,&addr->super_CService);
    vKey.m_size = (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
    vKey.m_data = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    bVar6 = CRollingBloomFilter::contains(this_00,vKey);
    if (!bVar6) {
      bVar6 = true;
      if (((peer->m_wants_addrv2)._M_base._M_i & 1U) == 0) {
        bVar6 = CNetAddr::IsAddrV1Compatible((CNetAddr *)addr);
      }
      goto LAB_001e878e;
    }
  }
  bVar6 = false;
LAB_001e878e:
  if ((bVar5) &&
     (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0)) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar6 != false) {
    uVar9 = ((long)(peer->m_addrs_to_send).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(peer->m_addrs_to_send).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    if (uVar9 < 1000) {
      std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&peer->m_addrs_to_send,addr);
    }
    else {
      uVar9 = uVar9 - 1;
      if (uVar9 == 0) {
        uVar7 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar7 = (uint)lVar2 ^ 0x3f;
      }
      do {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&(this->m_rng).super_RandomMixin<FastRandomContext>,0x40 - uVar7);
      } while (uVar9 < uVar8);
      pCVar1 = (peer->m_addrs_to_send).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
               _M_impl.super__Vector_impl_data._M_start;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)(pCVar1 + uVar8),
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)addr);
      uVar4 = (addr->super_CService).super_CNetAddr.m_scope_id;
      pCVar1[uVar8].super_CService.super_CNetAddr.m_net =
           (addr->super_CService).super_CNetAddr.m_net;
      pCVar1[uVar8].super_CService.super_CNetAddr.m_scope_id = uVar4;
      pCVar1[uVar8].super_CService.port = (addr->super_CService).port;
      SVar3 = addr->nServices;
      pCVar1[uVar8].nTime.__d.__r = (addr->nTime).__d.__r;
      (&pCVar1[uVar8].nTime)[1] = (NodeSeconds)SVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::PushAddress(Peer& peer, const CAddress& addr)
{
    // Known checking here is only to save space from duplicates.
    // Before sending, we'll filter it again for known addresses that were
    // added after addresses were pushed.
    assert(peer.m_addr_known);
    if (addr.IsValid() && !peer.m_addr_known->contains(addr.GetKey()) && IsAddrCompatible(peer, addr)) {
        if (peer.m_addrs_to_send.size() >= MAX_ADDR_TO_SEND) {
            peer.m_addrs_to_send[m_rng.randrange(peer.m_addrs_to_send.size())] = addr;
        } else {
            peer.m_addrs_to_send.push_back(addr);
        }
    }
}